

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O3

Cord __thiscall
absl::lts_20250127::Cord::ChunkIterator::AdvanceAndReadBytes(ChunkIterator *this,size_t n)

{
  byte bVar1;
  Nullable<CordRep_*> pCVar2;
  RefcountAndFlags *pRVar3;
  uint8_t *puVar4;
  Nullable<CordRep_*> node;
  int64_t iVar5;
  ulong in_RDX;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *pcVar6;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  char *extraout_RDX_04;
  char *extraout_RDX_05;
  char *extraout_RDX_06;
  char *extraout_RDX_07;
  char *extraout_RDX_08;
  ChunkIterator *__dest;
  ulong uVar7;
  ulong uVar8;
  ChunkIterator *unaff_R13;
  size_type __rlen;
  long *in_FS_OFFSET;
  string_view sVar9;
  Cord CVar10;
  string_view src;
  CordRep *rep;
  anon_union_16_2_39e9c77e_for_Rep_0 local_48;
  
  __dest = this;
  if (*(ulong *)(n + 0x18) < in_RDX) {
LAB_00290454:
    AdvanceAndReadBytes();
LAB_00290459:
    AdvanceAndReadBytes();
    this = unaff_R13;
  }
  else {
    (this->current_chunk_)._M_len = 0;
    (this->current_chunk_)._M_str = (char *)0x0;
    if (in_RDX < 0x10) {
      *(char *)&(this->current_chunk_)._M_len = (char)in_RDX * '\x02';
      __dest = (ChunkIterator *)((long)&(this->current_chunk_)._M_len + 1);
      uVar7 = *(ulong *)n;
      if (uVar7 < in_RDX) {
        sVar9._M_str = *(char **)(n + 8);
        sVar9._M_len = uVar7;
        unaff_R13 = __dest;
        do {
          uVar8 = sVar9._M_len;
          __dest = unaff_R13;
          memcpy(unaff_R13,sVar9._M_str,uVar8);
          uVar7 = *(ulong *)(n + 0x18);
          if (uVar7 == 0) {
            AdvanceAndReadBytes();
            goto LAB_00290454;
          }
          __dest = (ChunkIterator *)((unaff_R13->btree_reader_).navigator_.index_ + (uVar8 - 0x2c));
          in_RDX = in_RDX - uVar8;
          if (uVar7 < uVar8) goto LAB_002904db;
          *(ulong *)(n + 0x18) = uVar7 - uVar8;
          if (uVar7 - uVar8 != 0) {
            if (((long)*(int *)(n + 0x28) < 0) ||
               (*(long *)(n + 0x38 + (long)*(int *)(n + 0x28) * 8) == 0)) {
              if (uVar8 == 0) {
                __assert_fail("!current_chunk_.empty()",
                              "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/cord.h"
                              ,0x617,"Cord::ChunkIterator &absl::Cord::ChunkIterator::operator++()")
                ;
              }
              *(undefined8 *)n = 0;
              *(undefined8 *)(n + 8) = 0;
              sVar9 = (string_view)ZEXT816(0);
            }
            else {
              sVar9 = cord_internal::CordRepBtreeReader::Next((CordRepBtreeReader *)(n + 0x20));
              *(string_view *)n = sVar9;
            }
          }
          unaff_R13 = __dest;
        } while (sVar9._M_len < in_RDX);
      }
      else {
        sVar9._M_str = *(char **)(n + 8);
        sVar9._M_len = uVar7;
      }
      uVar7 = sVar9._M_len;
      memcpy(__dest,sVar9._M_str,in_RDX);
      pcVar6 = extraout_RDX_01;
      if (in_RDX <= uVar7 && uVar7 - in_RDX != 0) {
        *(char **)(n + 8) = sVar9._M_str + in_RDX;
        *(ulong *)n = uVar7 - in_RDX;
        *(long *)(n + 0x18) = *(long *)(n + 0x18) - in_RDX;
        goto LAB_00290434;
      }
      if (in_RDX == 0) goto LAB_00290434;
      uVar8 = *(ulong *)(n + 0x18);
      unaff_R13 = this;
      if (uVar8 != 0) {
        if (uVar8 < uVar7) {
LAB_002904db:
          __assert_fail("bytes_remaining_ >= current_chunk_.size()",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/cord.h"
                        ,0x611,"Cord::ChunkIterator &absl::Cord::ChunkIterator::operator++()");
        }
        *(ulong *)(n + 0x18) = uVar8 - uVar7;
        if (uVar8 - uVar7 != 0) {
          if (((long)*(int *)(n + 0x28) < 0) ||
             (*(long *)(n + 0x38 + (long)*(int *)(n + 0x28) * 8) == 0)) {
            *(undefined8 *)n = 0;
            *(undefined8 *)(n + 8) = 0;
          }
          else {
            sVar9 = cord_internal::CordRepBtreeReader::Next((CordRepBtreeReader *)(n + 0x20));
            pcVar6 = sVar9._M_str;
            *(string_view *)n = sVar9;
          }
        }
        goto LAB_00290434;
      }
      goto LAB_00290459;
    }
    if ((-1 < (long)*(int *)(n + 0x28)) && (*(long *)(n + 0x38 + (long)*(int *)(n + 0x28) * 8) != 0)
       ) {
      uVar7 = *(ulong *)n;
      if (in_RDX < 0x200 && in_RDX <= uVar7) {
        src._M_str = *(char **)(n + 8);
        src._M_len = in_RDX;
        Cord((Cord *)&local_48.as_tree,src,kCordReader);
        if (((this->current_chunk_)._M_len & 1) != 0) {
          InlineRep::UnrefTree((InlineRep *)this);
        }
        (this->current_chunk_)._M_len = local_48.as_tree.cordz_info;
        (this->current_chunk_)._M_str = (char *)local_48.as_tree.rep;
        local_48.as_tree.cordz_info = 0;
        local_48.as_tree.rep = (CordRep *)0x0;
        ~Cord((Cord *)&local_48.as_tree);
        if (in_RDX < uVar7) {
          *(long *)(n + 8) = *(long *)(n + 8) + in_RDX;
          *(ulong *)n = *(long *)n - in_RDX;
          pcVar6 = extraout_RDX;
        }
        else {
          sVar9 = cord_internal::CordRepBtreeReader::Next((CordRepBtreeReader *)(n + 0x20));
          pcVar6 = sVar9._M_str;
          *(string_view *)n = sVar9;
        }
      }
      else {
        sVar9 = cord_internal::CordRepBtreeReader::Read
                          ((CordRepBtreeReader *)(n + 0x20),in_RDX,uVar7,(CordRep **)&local_48);
        pcVar6 = sVar9._M_str;
        *(string_view *)n = sVar9;
        if ((char *)local_48.as_tree.cordz_info == (char *)0x0) {
          __assert_fail("rep",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/cord.h"
                        ,0x4e8,
                        "void absl::Cord::InlineRep::EmplaceTree(absl::Nonnull<CordRep *>, MethodIdentifier)"
                       );
        }
        (this->current_chunk_)._M_str = (char *)local_48.as_tree.cordz_info;
        (this->current_chunk_)._M_len = 1;
        if (in_FS_OFFSET[-0xb] < 2) {
          iVar5 = cord_internal::cordz_should_profile_slow((SamplingState *)(*in_FS_OFFSET + -0x58))
          ;
          pcVar6 = extraout_RDX_07;
          if (0 < iVar5) {
            cord_internal::CordzInfo::TrackCord((InlineData *)this,kCordReader,iVar5);
            pcVar6 = extraout_RDX_08;
          }
        }
        else {
          in_FS_OFFSET[-0xb] = in_FS_OFFSET[-0xb] + -1;
        }
      }
      *(long *)(n + 0x18) = *(long *)(n + 0x18) - in_RDX;
      goto LAB_00290434;
    }
    pCVar2 = *(Nullable<CordRep_*> *)(n + 0x10);
    if (pCVar2 == (Nullable<CordRep_*>)0x0) {
      __assert_fail("current_leaf_ != nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/cord.cc"
                    ,0x46a,"Cord absl::Cord::ChunkIterator::AdvanceAndReadBytes(size_t)");
    }
    if (pCVar2->length != in_RDX) {
      pRVar3 = (RefcountAndFlags *)(n + 0x10);
      if (pCVar2->tag == '\x01') {
        pRVar3 = &pCVar2[1].refcount;
      }
      pCVar2 = *(Nullable<CordRep_*> *)pRVar3;
      bVar1 = pCVar2->tag;
      if (bVar1 == 5) {
        puVar4 = (uint8_t *)pCVar2[1].length;
      }
      else {
        if ((bVar1 - 0xf9 < 7) || (bVar1 < 5)) {
          __assert_fail("tag >= FLAT && tag <= MAX_FLAT_TAG",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/cord_rep_flat.h"
                        ,0xb6,"CordRepFlat *absl::cord_internal::CordRep::flat()");
        }
        puVar4 = pCVar2->storage;
      }
      uVar8 = *(long *)(n + 8) - (long)puVar4;
      uVar7 = pCVar2->length;
      if (uVar7 <= uVar8) {
        __assert_fail("pos < rep->length",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/cord_internal.h"
                      ,0x1a5,
                      "static CordRep *absl::cord_internal::CordRepSubstring::Substring(CordRep *, size_t, size_t)"
                     );
      }
      if (uVar7 - uVar8 < in_RDX) {
        __assert_fail("n <= rep->length - pos",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/cord_internal.h"
                      ,0x1a6,
                      "static CordRep *absl::cord_internal::CordRepSubstring::Substring(CordRep *, size_t, size_t)"
                     );
      }
      if (uVar7 == in_RDX) {
        LOCK();
        (pCVar2->refcount).count_.super___atomic_base<int>._M_i =
             (pCVar2->refcount).count_.super___atomic_base<int>._M_i + 2;
        UNLOCK();
        node = pCVar2;
      }
      else {
        node = (Nullable<CordRep_*>)operator_new(0x20);
        node->length = 0;
        node->refcount = (atomic<int>)0x0;
        node->tag = '\0';
        node->storage[0] = '\0';
        node->storage[1] = '\0';
        node->storage[2] = '\0';
        (node->refcount).count_.super___atomic_base<int>._M_i = 2;
        node->length = in_RDX;
        node->tag = '\x01';
        node[1].length = uVar8;
        LOCK();
        (pCVar2->refcount).count_.super___atomic_base<int>._M_i =
             (pCVar2->refcount).count_.super___atomic_base<int>._M_i + 2;
        UNLOCK();
        *(Nullable<CordRep_*> *)&node[1].refcount = pCVar2;
      }
      VerifyTree(node);
      (this->current_chunk_)._M_str = (char *)node;
      (this->current_chunk_)._M_len = 1;
      if (in_FS_OFFSET[-0xb] < 2) {
        iVar5 = cord_internal::cordz_should_profile_slow((SamplingState *)(*in_FS_OFFSET + -0x58));
        pcVar6 = extraout_RDX_05;
        if (0 < iVar5) {
          cord_internal::CordzInfo::TrackCord((InlineData *)this,kCordReader,iVar5);
          pcVar6 = extraout_RDX_06;
        }
      }
      else {
        in_FS_OFFSET[-0xb] = in_FS_OFFSET[-0xb] + -1;
        pcVar6 = extraout_RDX_02;
      }
      *(long *)(n + 0x18) = *(long *)(n + 0x18) - in_RDX;
      *(long *)(n + 8) = *(long *)(n + 8) + in_RDX;
      *(ulong *)n = *(long *)n - in_RDX;
      goto LAB_00290434;
    }
    *(undefined8 *)(n + 0x18) = 0;
    *(undefined8 *)n = 0;
    *(undefined8 *)(n + 8) = 0;
    LOCK();
    (pCVar2->refcount).count_.super___atomic_base<int>._M_i =
         (pCVar2->refcount).count_.super___atomic_base<int>._M_i + 2;
    UNLOCK();
    VerifyTree(pCVar2);
    (this->current_chunk_)._M_str = (char *)pCVar2;
    (this->current_chunk_)._M_len = 1;
    __dest = (ChunkIterator *)0xffffffffffffffa8;
    if (1 < in_FS_OFFSET[-0xb]) {
      in_FS_OFFSET[-0xb] = in_FS_OFFSET[-0xb] + -1;
      pcVar6 = extraout_RDX_00;
      goto LAB_00290434;
    }
  }
  iVar5 = cord_internal::cordz_should_profile_slow
                    ((SamplingState *)
                     ((__dest->btree_reader_).navigator_.index_ + *in_FS_OFFSET + -0x2c));
  pcVar6 = extraout_RDX_03;
  if (0 < iVar5) {
    cord_internal::CordzInfo::TrackCord((InlineData *)this,kCordReader,iVar5);
    pcVar6 = extraout_RDX_04;
  }
LAB_00290434:
  CVar10.contents_.data_.rep_.field_0.as_tree.rep = (CordRep *)pcVar6;
  CVar10.contents_.data_.rep_.field_0.as_tree.cordz_info = (cordz_info_t)this;
  return (Cord)CVar10.contents_.data_.rep_.field_0;
}

Assistant:

Cord Cord::ChunkIterator::AdvanceAndReadBytes(size_t n) {
  ABSL_HARDENING_ASSERT(bytes_remaining_ >= n &&
                        "Attempted to iterate past `end()`");
  Cord subcord;
  auto constexpr method = CordzUpdateTracker::kCordReader;

  if (n <= InlineRep::kMaxInline) {
    // Range to read fits in inline data. Flatten it.
    char* data = subcord.contents_.set_data(n);
    while (n > current_chunk_.size()) {
      memcpy(data, current_chunk_.data(), current_chunk_.size());
      data += current_chunk_.size();
      n -= current_chunk_.size();
      ++*this;
    }
    memcpy(data, current_chunk_.data(), n);
    if (n < current_chunk_.size()) {
      RemoveChunkPrefix(n);
    } else if (n > 0) {
      ++*this;
    }
    return subcord;
  }

  if (btree_reader_) {
    size_t chunk_size = current_chunk_.size();
    if (n <= chunk_size && n <= kMaxBytesToCopy) {
      subcord = Cord(current_chunk_.substr(0, n), method);
      if (n < chunk_size) {
        current_chunk_.remove_prefix(n);
      } else {
        current_chunk_ = btree_reader_.Next();
      }
    } else {
      CordRep* rep;
      current_chunk_ = btree_reader_.Read(n, chunk_size, rep);
      subcord.contents_.EmplaceTree(rep, method);
    }
    bytes_remaining_ -= n;
    return subcord;
  }

  // Short circuit if reading the entire data edge.
  assert(current_leaf_ != nullptr);
  if (n == current_leaf_->length) {
    bytes_remaining_ = 0;
    current_chunk_ = {};
    CordRep* tree = CordRep::Ref(current_leaf_);
    subcord.contents_.EmplaceTree(VerifyTree(tree), method);
    return subcord;
  }

  // From this point on, we need a partial substring node.
  // Get pointer to the underlying flat or external data payload and
  // compute data pointer and offset into current flat or external.
  CordRep* payload = current_leaf_->IsSubstring()
                         ? current_leaf_->substring()->child
                         : current_leaf_;
  const char* data = payload->IsExternal() ? payload->external()->base
                                           : payload->flat()->Data();
  const size_t offset = static_cast<size_t>(current_chunk_.data() - data);

  auto* tree = CordRepSubstring::Substring(payload, offset, n);
  subcord.contents_.EmplaceTree(VerifyTree(tree), method);
  bytes_remaining_ -= n;
  current_chunk_.remove_prefix(n);
  return subcord;
}